

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void bc_trie_size_node(bc_trie_node_t *node,size_t *count)

{
  if (count != (size_t *)0x0) {
    for (; node != (bc_trie_node_t *)0x0; node = node->child) {
      if (node->key == '\0') {
        *count = *count + 1;
      }
      bc_trie_size_node(node->next,count);
    }
  }
  return;
}

Assistant:

static void
bc_trie_size_node(bc_trie_node_t *node, size_t *count)
{
    if (node == NULL || count == NULL)
        return;

    if (node->key == '\0')
        (*count)++;

    bc_trie_size_node(node->next, count);
    bc_trie_size_node(node->child, count);
}